

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot.h
# Opt level: O1

storage_range_t
calculateMedianRange<Result<unsigned_int,double>>
          (vector<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_> *rs,
          function<const_std::vector<double,_std::allocator<double>_>_&(const_Result<unsigned_int,_double>_&)>
          *valuesFunc,storage_t sizePercent)

{
  pointer pRVar1;
  long lVar2;
  vector<double,_std::allocator<double>_> *__x;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pRVar6;
  double dVar7;
  double dVar8;
  storage_range_t sVar9;
  vector<double,_std::allocator<double>_> v;
  vector<double,_std::allocator<double>_> local_60;
  storage_t local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  
  pRVar6 = (rs->
           super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (rs->
           super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar6 == pRVar1) {
    dVar7 = 1.79769313486232e+308;
    dVar8 = -1.79769313486232e+308;
  }
  else {
    dVar8 = -1.79769313486232e+308;
    dVar7 = 1.79769313486232e+308;
    local_48 = sizePercent;
    do {
      local_30 = dVar7;
      local_28 = dVar8;
      if ((valuesFunc->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      __x = (*valuesFunc->_M_invoker)((_Any_data *)valuesFunc,pRVar6);
      std::vector<double,_std::allocator<double>_>::vector(&local_60,__x);
      lVar3 = (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if ((lVar3 != 0) &&
         ((pointer)((lVar3 >> 1 & 0xfffffffffffffff8U) +
                   (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) !=
          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        lVar2 = 0x3f;
        if (lVar3 >> 3 != 0) {
          for (; (ulong)(lVar3 >> 3) >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        std::
        __introselect<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  ();
      }
      uVar4 = (ulong)((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) >> 1;
      dVar7 = ((double)uVar4 * local_48) / 100.0;
      uVar5 = (ulong)dVar7;
      uVar5 = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
      dVar7 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4 - uVar5];
      dVar8 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4 + uVar5];
      if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        local_40 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4 - uVar5];
        local_38 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4 + uVar5];
        operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
        dVar7 = local_40;
        dVar8 = local_38;
      }
      if (local_30 <= dVar7) {
        dVar7 = local_30;
      }
      if (dVar8 <= local_28) {
        dVar8 = local_28;
      }
      pRVar6 = pRVar6 + 1;
    } while (pRVar6 != pRVar1);
  }
  sVar9.second = dVar8;
  sVar9.first = dVar7;
  return sVar9;
}

Assistant:

typename ResultT::storage_range_t calculateMedianRange(const std::vector<ResultT>& rs, std::function<const std::vector<typename ResultT::storage_t>&(const ResultT&)> valuesFunc, typename ResultT::storage_t sizePercent)
{
    // calculate min / max percentage range of all values around median
    typename ResultT::storage_range_t rangeMinMax(std::numeric_limits<typename ResultT::storage_t>::max(), std::numeric_limits<typename ResultT::storage_t>::lowest());
    for (const auto& r : rs)
    {
        // calculate median of values
        std::vector<typename ResultT::storage_t> v = valuesFunc(r);
        std::nth_element(v.begin(), v.begin() + v.size() / 2, v.end());
        auto medianIt = v.cbegin() + v.size() / 2;
        // now get sizePercent values centered around median
        const decltype(v.size()) halfRange = v.size() / 2 * sizePercent / 100;
        auto leftIt = std::prev(medianIt, halfRange);
        auto rightIt = std::next(medianIt, halfRange);
        rangeMinMax.first = std::min(rangeMinMax.first, *leftIt);
        rangeMinMax.second = std::max(rangeMinMax.second, *rightIt);
    }
    return rangeMinMax;
}